

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
randomx::JitCompilerX86::generateProgramEpilogue
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg)

{
  uint uVar1;
  uint uVar2;
  long in_RDX;
  JitCompilerX86 *in_RDI;
  uint32_t alignment_size;
  uint32_t branch_end;
  uint32_t branch_begin;
  uint8_t (*in_stack_ffffffffffffffc8) [3];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffc8);
  emitByte(in_RDI,(char)*(undefined4 *)(in_RDX + 0x10) + 0xc0);
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffc8);
  emitByte(in_RDI,(char)*(undefined4 *)(in_RDX + 0x14) + 0xc0);
  emit((JitCompilerX86 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
       (uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(size_t)in_RDI);
  memcpy(in_RDI->code + in_RDI->codePos,codeLoopStore,(long)loopStoreSize);
  in_RDI->codePos = loopStoreSize + in_RDI->codePos;
  if ((BranchesWithin32B & 1) != 0) {
    uVar3 = in_RDI->codePos;
    uVar1 = uVar3 + 9;
    if (0x1f < (uVar3 ^ uVar1)) {
      uVar2 = 0x20 - (uVar3 & 0x1f);
      if (8 < uVar2) {
        emit((JitCompilerX86 *)CONCAT44(uVar3,uVar1),
             (uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),(size_t)in_RDI);
        uVar2 = 8;
      }
      emit((JitCompilerX86 *)CONCAT44(uVar3,uVar1),
           (uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),(size_t)in_RDI);
    }
  }
  emit<3ul>(in_RDI,in_stack_ffffffffffffffc8);
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffc8);
  emit32(in_RDI,(prologueSize - in_RDI->codePos) - 4);
  emitByte(in_RDI,0xe9);
  emit32(in_RDI,(epilogueOffset - in_RDI->codePos) - 4);
  return;
}

Assistant:

void JitCompilerX86::generateProgramEpilogue(Program& prog, ProgramConfiguration& pcfg) {
		emit(REX_MOV_RR64);
		emitByte(0xc0 + pcfg.readReg0);
		emit(REX_XOR_RAX_R64);
		emitByte(0xc0 + pcfg.readReg1);
		emit((const uint8_t*)&randomx_prefetch_scratchpad, ((uint8_t*)&randomx_prefetch_scratchpad_end) - ((uint8_t*)&randomx_prefetch_scratchpad));
		memcpy(code + codePos, codeLoopStore, loopStoreSize);
		codePos += loopStoreSize;

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + 9);

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				uint32_t alignment_size = 32 - (branch_begin & 31);
				if (alignment_size > 8) {
					emit(NOPX[alignment_size - 9], alignment_size - 8);
					alignment_size = 8;
				}
				emit(NOPX[alignment_size - 1], alignment_size);
			}
		}

		emit(SUB_EBX);
		emit(JNZ);
		emit32(prologueSize - codePos - 4);
		emitByte(JMP);
		emit32(epilogueOffset - codePos - 4);
	}